

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
upb::generator::(anonymous_namespace)::StrongReferenceSingle_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDefPtr field)

{
  bool bVar1;
  char *__str;
  char *in_RCX;
  Arg *in_R8;
  string_view full_name;
  string_view format;
  MessageDefPtr local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string local_98;
  Arg local_78;
  basic_string_view<char,_std::char_traits<char>_> local_48 [2];
  allocator<char> local_21;
  MessageDefPtr local_20;
  FieldDefPtr local_18;
  FieldDefPtr field_local;
  
  local_18.ptr_ = (upb_FieldDef *)this;
  field_local.ptr_ = (upb_FieldDef *)__return_storage_ptr__;
  local_20 = FieldDefPtr::message_type(&local_18);
  bVar1 = MessageDefPtr::operator_cast_to_bool(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_48,"  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&$0)");
    local_b0 = FieldDefPtr::message_type(&local_18);
    __str = MessageDefPtr::full_name(&local_b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,__str);
    full_name._M_str = in_RCX;
    full_name._M_len = (size_t)local_a8._M_str;
    MiniTableMessageVarName_abi_cxx11_(&local_98,(generator *)local_a8._M_len,full_name);
    absl::lts_20240722::substitute_internal::Arg::Arg<std::allocator<char>>(&local_78,&local_98);
    format._M_str = (char *)&local_78;
    format._M_len = (size_t)local_48[0]._M_str;
    absl::lts_20240722::Substitute_abi_cxx11_
              (__return_storage_ptr__,(lts_20240722 *)local_48[0]._M_len,format,in_R8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrongReferenceSingle(upb::FieldDefPtr field) {
  if (!field.message_type()) return "";
  return absl::Substitute(
      "  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&$0)",
      MiniTableMessageVarName(field.message_type().full_name()));
}